

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::CumulativeReporterBase::
Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>::Node
          (Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *this,
          TestCaseStats *_value)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  
  (this->super_SharedImpl<Catch::IShared>).m_rc = 0;
  (this->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__Node_00172af8;
  (this->value)._vptr_TestCaseStats = (_func_int **)&PTR__TestCaseStats_00170ff0;
  TestCaseInfo::TestCaseInfo(&(this->value).testInfo,&_value->testInfo);
  sVar6 = (_value->totals).assertions.passed;
  uVar2 = *(undefined4 *)((long)&(_value->totals).assertions.passed + 4);
  sVar7 = (_value->totals).assertions.failed;
  uVar3 = *(undefined4 *)((long)&(_value->totals).assertions.failed + 4);
  uVar4 = *(undefined4 *)((long)&(_value->totals).testCases.passed + 4);
  sVar8 = (_value->totals).testCases.failed;
  uVar5 = *(undefined4 *)((long)&(_value->totals).testCases.failed + 4);
  *(int *)&(this->value).totals.testCases.passed = (int)(_value->totals).testCases.passed;
  *(undefined4 *)((long)&(this->value).totals.testCases.passed + 4) = uVar4;
  *(int *)&(this->value).totals.testCases.failed = (int)sVar8;
  *(undefined4 *)((long)&(this->value).totals.testCases.failed + 4) = uVar5;
  *(int *)&(this->value).totals.assertions.passed = (int)sVar6;
  *(undefined4 *)((long)&(this->value).totals.assertions.passed + 4) = uVar2;
  *(int *)&(this->value).totals.assertions.failed = (int)sVar7;
  *(undefined4 *)((long)&(this->value).totals.assertions.failed + 4) = uVar3;
  (this->value).stdOut._M_dataplus._M_p = (pointer)&(this->value).stdOut.field_2;
  pcVar1 = (_value->stdOut)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->value).stdOut,pcVar1,pcVar1 + (_value->stdOut)._M_string_length);
  (this->value).stdErr._M_dataplus._M_p = (pointer)&(this->value).stdErr.field_2;
  pcVar1 = (_value->stdErr)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->value).stdErr,pcVar1,pcVar1 + (_value->stdErr)._M_string_length);
  (this->value).aborting = _value->aborting;
  (this->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

explicit Node( T const& _value ) : value( _value ) {}